

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

GMappedFile * p2sc_map_file(char *name)

{
  GMappedFile *pGVar1;
  GError *err;
  
  pGVar1 = (GMappedFile *)g_mapped_file_new(name,0);
  if (pGVar1 == (GMappedFile *)0x0) {
    _p2sc_msg("p2sc_map_file",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x181,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s: file reading failed: unknown reason",name);
    exit(1);
  }
  return pGVar1;
}

Assistant:

GMappedFile *p2sc_map_file(const char *name) {
    GError *err = NULL;
    GMappedFile *map = g_mapped_file_new(name, FALSE, &err);

    if (!map) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s", err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: file reading failed: unknown reason", name);
    }

    return map;
}